

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::LRNLayerParams::ByteSizeLong(LRNLayerParams *this)

{
  int iVar1;
  uint64 uVar2;
  size_t sVar3;
  float fVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  LRNLayerParams *this_local;
  
  sStack_18 = 0;
  fVar4 = alpha(this);
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    sStack_18 = 5;
  }
  fVar4 = beta(this);
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    sStack_18 = sStack_18 + 5;
  }
  uVar2 = localsize(this);
  if (uVar2 != 0) {
    uVar2 = localsize(this);
    sVar3 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar2);
    sStack_18 = sVar3 + 1 + sStack_18;
  }
  fVar4 = k(this);
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    sStack_18 = sStack_18 + 5;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t LRNLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LRNLayerParams)
  size_t total_size = 0;

  // float alpha = 1;
  if (this->alpha() != 0) {
    total_size += 1 + 4;
  }

  // float beta = 2;
  if (this->beta() != 0) {
    total_size += 1 + 4;
  }

  // uint64 localSize = 3;
  if (this->localsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->localsize());
  }

  // float k = 4;
  if (this->k() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}